

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_clump.c
# Opt level: O0

REF_STATUS ref_clump_between(REF_GRID ref_grid,REF_INT node0,REF_INT node1,char *filename)

{
  REF_CELL pRVar1;
  REF_DICT ref_dict_00;
  REF_DICT ref_dict_01;
  uint uVar2;
  FILE *__stream;
  REF_INT local_158;
  REF_INT local_154;
  int local_150;
  REF_INT local_14c;
  REF_INT local_148;
  int local_144;
  REF_INT local_140;
  REF_INT local_13c;
  int local_138;
  REF_INT local_134;
  REF_INT local_130;
  int local_12c;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  FILE *f;
  char *zonetype;
  REF_INT nodes [27];
  REF_INT cell_node;
  REF_INT cell;
  REF_INT item;
  REF_CELL ref_cell;
  REF_DICT ref_dict;
  REF_DICT tet_dict;
  REF_DICT tri_dict;
  REF_DICT node_dict;
  char *filename_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_GRID ref_grid_local;
  
  node_dict = (REF_DICT)filename;
  filename_local._0_4_ = node1;
  filename_local._4_4_ = node0;
  _node1_local = ref_grid;
  uVar2 = ref_dict_create(&tri_dict);
  if (uVar2 == 0) {
    uVar2 = ref_dict_create(&tet_dict);
    if (uVar2 == 0) {
      uVar2 = ref_dict_create(&ref_dict);
      ref_dict_01 = tet_dict;
      if (uVar2 == 0) {
        pRVar1 = _node1_local->cell[3];
        if ((filename_local._4_4_ < 0) || (pRVar1->ref_adj->nnode <= filename_local._4_4_)) {
          local_12c = -1;
        }
        else {
          local_12c = pRVar1->ref_adj->first[filename_local._4_4_];
        }
        cell_node = local_12c;
        if (local_12c == -1) {
          local_130 = -1;
        }
        else {
          local_130 = pRVar1->ref_adj->item[local_12c].ref;
        }
        nodes[0x1a] = local_130;
        while (cell_node != -1) {
          uVar2 = ref_cell_nodes(pRVar1,nodes[0x1a],(REF_INT *)&zonetype);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                   ,0xca,"ref_clump_between",(ulong)uVar2,"n");
            return uVar2;
          }
          uVar2 = ref_dict_store(ref_dict_01,nodes[0x1a],0);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                   ,0xcb,"ref_clump_between",(ulong)uVar2,"store");
            return uVar2;
          }
          for (nodes[0x19] = 0; nodes[0x19] < pRVar1->node_per; nodes[0x19] = nodes[0x19] + 1) {
            uVar2 = ref_dict_store(tri_dict,nodes[(long)nodes[0x19] + -2],0);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                     ,0xcd,"ref_clump_between",(ulong)uVar2,"store");
              return uVar2;
            }
          }
          cell_node = pRVar1->ref_adj->item[cell_node].next;
          if (cell_node == -1) {
            local_134 = -1;
          }
          else {
            local_134 = pRVar1->ref_adj->item[cell_node].ref;
          }
          nodes[0x1a] = local_134;
        }
        if (((REF_INT)filename_local < 0) || (pRVar1->ref_adj->nnode <= (REF_INT)filename_local)) {
          local_138 = -1;
        }
        else {
          local_138 = pRVar1->ref_adj->first[(REF_INT)filename_local];
        }
        cell_node = local_138;
        if (local_138 == -1) {
          local_13c = -1;
        }
        else {
          local_13c = pRVar1->ref_adj->item[local_138].ref;
        }
        nodes[0x1a] = local_13c;
        while (ref_dict_00 = ref_dict, cell_node != -1) {
          uVar2 = ref_cell_nodes(pRVar1,nodes[0x1a],(REF_INT *)&zonetype);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                   ,0xd0,"ref_clump_between",(ulong)uVar2,"n");
            return uVar2;
          }
          uVar2 = ref_dict_store(ref_dict_01,nodes[0x1a],0);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                   ,0xd1,"ref_clump_between",(ulong)uVar2,"store");
            return uVar2;
          }
          for (nodes[0x19] = 0; nodes[0x19] < pRVar1->node_per; nodes[0x19] = nodes[0x19] + 1) {
            uVar2 = ref_dict_store(tri_dict,nodes[(long)nodes[0x19] + -2],0);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                     ,0xd3,"ref_clump_between",(ulong)uVar2,"store");
              return uVar2;
            }
          }
          cell_node = pRVar1->ref_adj->item[cell_node].next;
          if (cell_node == -1) {
            local_140 = -1;
          }
          else {
            local_140 = pRVar1->ref_adj->item[cell_node].ref;
          }
          nodes[0x1a] = local_140;
        }
        pRVar1 = _node1_local->cell[8];
        if ((filename_local._4_4_ < 0) || (pRVar1->ref_adj->nnode <= filename_local._4_4_)) {
          local_144 = -1;
        }
        else {
          local_144 = pRVar1->ref_adj->first[filename_local._4_4_];
        }
        cell_node = local_144;
        if (local_144 == -1) {
          local_148 = -1;
        }
        else {
          local_148 = pRVar1->ref_adj->item[local_144].ref;
        }
        nodes[0x1a] = local_148;
        while (cell_node != -1) {
          uVar2 = ref_cell_nodes(pRVar1,nodes[0x1a],(REF_INT *)&zonetype);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                   ,0xd8,"ref_clump_between",(ulong)uVar2,"n");
            return uVar2;
          }
          uVar2 = ref_dict_store(ref_dict_00,nodes[0x1a],0);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                   ,0xd9,"ref_clump_between",(ulong)uVar2,"store");
            return uVar2;
          }
          for (nodes[0x19] = 0; nodes[0x19] < pRVar1->node_per; nodes[0x19] = nodes[0x19] + 1) {
            uVar2 = ref_dict_store(tri_dict,nodes[(long)nodes[0x19] + -2],0);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                     ,0xdb,"ref_clump_between",(ulong)uVar2,"store");
              return uVar2;
            }
          }
          cell_node = pRVar1->ref_adj->item[cell_node].next;
          if (cell_node == -1) {
            local_14c = -1;
          }
          else {
            local_14c = pRVar1->ref_adj->item[cell_node].ref;
          }
          nodes[0x1a] = local_14c;
        }
        if (((REF_INT)filename_local < 0) || (pRVar1->ref_adj->nnode <= (REF_INT)filename_local)) {
          local_150 = -1;
        }
        else {
          local_150 = pRVar1->ref_adj->first[(REF_INT)filename_local];
        }
        cell_node = local_150;
        if (local_150 == -1) {
          local_154 = -1;
        }
        else {
          local_154 = pRVar1->ref_adj->item[local_150].ref;
        }
        nodes[0x1a] = local_154;
        while (cell_node != -1) {
          uVar2 = ref_cell_nodes(pRVar1,nodes[0x1a],(REF_INT *)&zonetype);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                   ,0xde,"ref_clump_between",(ulong)uVar2,"n");
            return uVar2;
          }
          uVar2 = ref_dict_store(ref_dict_00,nodes[0x1a],0);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                   ,0xdf,"ref_clump_between",(ulong)uVar2,"store");
            return uVar2;
          }
          for (nodes[0x19] = 0; nodes[0x19] < pRVar1->node_per; nodes[0x19] = nodes[0x19] + 1) {
            uVar2 = ref_dict_store(tri_dict,nodes[(long)nodes[0x19] + -2],0);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                     ,0xe1,"ref_clump_between",(ulong)uVar2,"store");
              return uVar2;
            }
          }
          cell_node = pRVar1->ref_adj->item[cell_node].next;
          if (cell_node == -1) {
            local_158 = -1;
          }
          else {
            local_158 = pRVar1->ref_adj->item[cell_node].ref;
          }
          nodes[0x1a] = local_158;
        }
        __stream = fopen((char *)node_dict,"w");
        if (__stream == (FILE *)0x0) {
          printf("unable to open %s\n",node_dict);
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 0xe6,"ref_clump_between","unable to open file");
          ref_grid_local._4_4_ = 2;
        }
        else {
          fprintf(__stream,"title=\"tecplot refine clump file\"\n");
          fprintf(__stream,"variables = \"x\" \"y\" \"z\" \"xm\" \"ym\" \"zm\" \"g\"\n");
          uVar2 = ref_clump_zone_around
                            ((FILE *)__stream,_node1_local->cell[3],tet_dict,"fetriangle",tri_dict,
                             _node1_local->node,filename_local._4_4_);
          if (uVar2 == 0) {
            uVar2 = ref_clump_zone_around
                              ((FILE *)__stream,_node1_local->cell[8],ref_dict,"fetetrahedron",
                               tri_dict,_node1_local->node,filename_local._4_4_);
            if (uVar2 == 0) {
              fclose(__stream);
              uVar2 = ref_dict_free(ref_dict);
              if (uVar2 == 0) {
                uVar2 = ref_dict_free(tet_dict);
                if (uVar2 == 0) {
                  ref_grid_local._4_4_ = ref_dict_free(tri_dict);
                  if (ref_grid_local._4_4_ == 0) {
                    ref_grid_local._4_4_ = 0;
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                           ,0xfd,"ref_clump_between",(ulong)ref_grid_local._4_4_,"free nodes");
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                         ,0xfc,"ref_clump_between",(ulong)uVar2,"free tris");
                  ref_grid_local._4_4_ = uVar2;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                       ,0xfb,"ref_clump_between",(ulong)uVar2,"free tet");
                ref_grid_local._4_4_ = uVar2;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                     ,0xf7,"ref_clump_between",(ulong)uVar2,"zone");
              ref_grid_local._4_4_ = uVar2;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                   ,0xf0,"ref_clump_between",(ulong)uVar2,"zone");
            ref_grid_local._4_4_ = uVar2;
          }
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
               0xc5,"ref_clump_between",(ulong)uVar2,"create tets");
        ref_grid_local._4_4_ = uVar2;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",0xc4,
             "ref_clump_between",(ulong)uVar2,"create tris");
      ref_grid_local._4_4_ = uVar2;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",0xc3,
           "ref_clump_between",(ulong)uVar2,"create nodes");
    ref_grid_local._4_4_ = uVar2;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_clump_between(REF_GRID ref_grid, REF_INT node0,
                                     REF_INT node1, const char *filename) {
  REF_DICT node_dict, tri_dict, tet_dict;
  REF_DICT ref_dict;
  REF_CELL ref_cell;
  REF_INT item, cell, cell_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  const char *zonetype;

  FILE *f;

  RSS(ref_dict_create(&node_dict), "create nodes");
  RSS(ref_dict_create(&tri_dict), "create tris");
  RSS(ref_dict_create(&tet_dict), "create tets");

  ref_cell = ref_grid_tri(ref_grid);
  ref_dict = tri_dict;
  each_ref_cell_having_node(ref_cell, node0, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    RSS(ref_dict_store(ref_dict, cell, 0), "store");
    each_ref_cell_cell_node(ref_cell, cell_node)
        RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
  }
  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    RSS(ref_dict_store(ref_dict, cell, 0), "store");
    each_ref_cell_cell_node(ref_cell, cell_node)
        RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
  }
  ref_cell = ref_grid_tet(ref_grid);
  ref_dict = tet_dict;
  each_ref_cell_having_node(ref_cell, node0, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    RSS(ref_dict_store(ref_dict, cell, 0), "store");
    each_ref_cell_cell_node(ref_cell, cell_node)
        RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
  }
  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    RSS(ref_dict_store(ref_dict, cell, 0), "store");
    each_ref_cell_cell_node(ref_cell, cell_node)
        RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
  }

  f = fopen(filename, "w");
  if (NULL == (void *)f) printf("unable to open %s\n", filename);
  RNS(f, "unable to open file");

  fprintf(f, "title=\"tecplot refine clump file\"\n");
  fprintf(f, "variables = \"x\" \"y\" \"z\" \"xm\" \"ym\" \"zm\" \"g\"\n");

  ref_cell = ref_grid_tri(ref_grid);
  ref_dict = tri_dict;
  zonetype = "fetriangle";
  RSS(ref_clump_zone_around(f, ref_cell, ref_dict, zonetype, node_dict,
                            ref_grid_node(ref_grid), node0),
      "zone");

  ref_cell = ref_grid_tet(ref_grid);
  ref_dict = tet_dict;
  zonetype = "fetetrahedron";
  RSS(ref_clump_zone_around(f, ref_cell, ref_dict, zonetype, node_dict,
                            ref_grid_node(ref_grid), node0),
      "zone");

  fclose(f);

  RSS(ref_dict_free(tet_dict), "free tet");
  RSS(ref_dict_free(tri_dict), "free tris");
  RSS(ref_dict_free(node_dict), "free nodes");

  return REF_SUCCESS;
}